

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.h
# Opt level: O0

string_view __thiscall
absl::lts_20250127::StripLeadingAsciiWhitespace(lts_20250127 *this,string_view str)

{
  const_iterator pvVar1;
  const_iterator __last;
  char *pcVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  string_view sVar4;
  char *it;
  string_view str_local;
  
  str_local._M_len = str._M_len;
  it = (char *)this;
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)&it);
  __last = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)&it);
  pcVar2 = std::find_if_not<char_const*,bool(*)(unsigned_char)>(pvVar1,__last,ascii_isspace);
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)&it);
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)&it,
                     (long)pcVar2 - (long)pvVar1,0xffffffffffffffff);
  sVar4._M_len = bVar3._M_len;
  sVar4._M_str = bVar3._M_str;
  return sVar4;
}

Assistant:

ABSL_MUST_USE_RESULT inline absl::string_view StripLeadingAsciiWhitespace(
    absl::string_view str) {
  auto it = std::find_if_not(str.begin(), str.end(), absl::ascii_isspace);
  return str.substr(static_cast<size_t>(it - str.begin()));
}